

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.cxx
# Opt level: O3

void undo_checkpoint(void)

{
  int iVar1;
  int in_EDX;
  char filename [2048];
  char acStack_808 [2048];
  
  if (undo_paused == '\0') {
    undo_filename(undo_current,acStack_808,in_EDX);
    iVar1 = write_file(acStack_808,0);
    if (iVar1 == 0) {
      perror(acStack_808);
    }
    else {
      iVar1 = undo_current;
      if ((modflag == 0) || (iVar1 = -1, undo_current <= undo_save)) {
        undo_save = iVar1;
      }
      undo_last = undo_current + 1;
      if (undo_max <= undo_current) {
        undo_max = undo_last;
      }
      Main_Menu[0x19].flags._0_1_ = (byte)Main_Menu[0x19].flags & 0xfe;
      Main_Menu[0x1a].flags._0_1_ = (byte)Main_Menu[0x1a].flags | 1;
      undo_current = undo_last;
    }
  }
  return;
}

Assistant:

void undo_checkpoint() {
  char	filename[FL_PATH_MAX];			// Undo checkpoint filename

//  printf("undo_checkpoint(): undo_current=%d, undo_paused=%d, modflag=%d\n",
//         undo_current, undo_paused, modflag);

  // Don't checkpoint if undo_suspend() has been called...
  if (undo_paused) return;

  // Save the current UI to a checkpoint file...
  if (!write_file(undo_filename(undo_current, filename, sizeof(filename)))) {
    // Don't attempt to do undo stuff if we can't write a checkpoint file...
    perror(filename);
    return;
  }

  // Update the saved level...
  if (modflag && undo_current <= undo_save) undo_save = -1;
  else if (!modflag) undo_save = undo_current;

  // Update the current undo level...
  undo_current ++;
  undo_last = undo_current;
  if (undo_current > undo_max) undo_max = undo_current;

  // Enable the Undo and disable the Redo menu items...
  Main_Menu[UNDO_ITEM].activate();
  Main_Menu[REDO_ITEM].deactivate();
}